

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

size_t ggml_graph_nbytes(size_t size,_Bool grads)

{
  long lVar1;
  size_t sVar2;
  size_t l;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = 0;
  uVar4 = 0x20;
  do {
    uVar5 = uVar4 + uVar6 >> 1;
    if (ggml_hash_size::primes[uVar5] < size * 2) {
      uVar6 = uVar5 + 1;
      uVar5 = uVar4;
    }
    uVar4 = uVar5;
  } while (uVar6 < uVar5);
  if (uVar6 < 0x20) {
    sVar2 = ggml_hash_size::primes[uVar6];
  }
  else {
    sVar2 = size * 2 | 1;
  }
  lVar1 = size * 0x10 + 0x50 + sVar2 * 8;
  lVar3 = lVar1 + sVar2 * 0x10;
  if (!grads) {
    lVar3 = lVar1;
  }
  return lVar3 + (sVar2 + 0x1f >> 5) * 4;
}

Assistant:

static size_t ggml_graph_nbytes(size_t size, bool grads) {
    size_t hash_size = ggml_hash_size(size * 2);
    void * p = 0;
    incr_ptr_aligned(&p, sizeof(struct ggml_cgraph), 1);
    incr_ptr_aligned(&p, size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // nodes
    incr_ptr_aligned(&p, size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // leafs
    incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // hash keys
    if (grads) {
        incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // grads
        incr_ptr_aligned(&p, hash_size * sizeof(struct ggml_tensor *), sizeof(struct ggml_tensor *)); // grad_accs
    }
    incr_ptr_aligned(&p, ggml_bitset_size(hash_size) * sizeof(ggml_bitset_t), sizeof(ggml_bitset_t));

    size_t nbytes = (size_t) p;
    return nbytes;
}